

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t archive_read_format_lha_options(archive_read *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  wchar_t wVar3;
  archive_string_conv *paVar4;
  
  pvVar1 = a->format->data;
  iVar2 = strcmp(key,"hdrcharset");
  wVar3 = L'\xffffffec';
  if (iVar2 == 0) {
    if ((val == (char *)0x0) || (*val == '\0')) {
      archive_set_error(&a->archive,-1,"lha: hdrcharset option needs a character-set name");
      wVar3 = L'\xffffffe7';
    }
    else {
      paVar4 = archive_string_conversion_from_charset((archive_conflict *)a,val,L'\0');
      *(archive_string_conv **)((long)pvVar1 + 0xd0) = paVar4;
      wVar3 = L'\xffffffe2';
      if (paVar4 != (archive_string_conv *)0x0) {
        wVar3 = L'\0';
      }
    }
  }
  return wVar3;
}

Assistant:

static int
archive_read_format_lha_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct lha *lha;
	int ret = ARCHIVE_FAILED;

	lha = (struct lha *)(a->format->data);
	if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lha: hdrcharset option needs a character-set name");
		else {
			lha->opt_sconv =
			    archive_string_conversion_from_charset(
				&a->archive, val, 0);
			if (lha->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}